

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamWriter::writeCDATA(QXmlStreamWriter *this,QAnyStringView text)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  void *pvVar1;
  ulong uVar2;
  size_t in_RCX;
  size_t __n;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QAnyStringView local_68;
  QLatin1String local_58;
  undefined8 local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
       .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl;
  local_68 = text;
  QXmlStreamWriterPrivate::finishStartElement(this_00._M_head_impl,true);
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])"<![CDATA[");
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x519cea,pvVar1,in_RCX);
  while( true ) {
    __n = 0x3fffffffffffffff;
    if (((undefined1  [16])text & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0)
    break;
    local_48 = 3;
    local_40 = "]]>";
    __n = 0;
    s.m_data = "]]>";
    s.m_size = 3;
    local_58.m_size = text.m_size & 0x3fffffffffffffff;
    local_58.m_data = text.field_0;
    uVar2 = QLatin1String::indexOf(&local_58,s,0,CaseSensitive);
    text = local_68;
    if ((long)uVar2 < 0) break;
    QXmlStreamWriterPrivate::write
              (this_00._M_head_impl,local_68.field_0._0_4_,
               (void *)(local_68.m_size & 0xc000000000000000 | uVar2),__n);
    pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,16ul>((char (*) [16])"]]]]><![CDATA[>");
    QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x519cf4,pvVar1,__n);
    text = QAnyStringView::sliced(&local_68,uVar2 + 3);
    local_68 = text;
  }
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,text.field_0._0_4_,(void *)text.m_size,__n);
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,4ul>((char (*) [4])"]]>");
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x519727,pvVar1,__n);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamWriter::writeCDATA(QAnyStringView text)
{
    Q_D(QXmlStreamWriter);
    d->finishStartElement();
    d->write("<![CDATA[");
    while (!text.isEmpty()) {
        const auto idx = indexOf(text, "]]>"_L1);
        if (idx < 0)
            break;                   // no forbidden sequence found
        d->write(text.first(idx));
        d->write("]]"                // text[idx, idx + 2)
                 "]]><![CDATA["      // escape sequence to separate ]] and >
                 ">");               // text[idx + 2, idx + 3)
        text = text.sliced(idx + 3); // skip over "]]>"
    }
    d->write(text); // write remainder
    d->write("]]>");
}